

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O0

bool __thiscall BanMan::Unban(BanMan *this,CSubNet *sub_net)

{
  long lVar1;
  size_type sVar2;
  AnnotatedMixin<std::mutex> *in_RSI;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_RDI;
  long in_FS_OFFSET;
  BanMan *in_stack_00000018;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock10;
  CClientUIInterface *in_stack_ffffffffffffff98;
  key_type *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  UniqueLock<AnnotatedMixin<std::mutex>_> *this_00;
  byte local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffff98);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (this_00,in_RSI,in_stack_ffffffffffffffc8,
             (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x18,0));
  sVar2 = std::
          map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
          ::erase((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
                   *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                  in_stack_ffffffffffffffa0);
  if (sVar2 != 0) {
    in_RDI[5].super_unique_lock._M_owns = true;
  }
  else {
    local_19 = 0;
  }
  uVar3 = (uint)(sVar2 == 0);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff98);
  if (uVar3 == 0) {
    if (in_RDI[6].super_unique_lock._M_device != (mutex_type *)0x0) {
      CClientUIInterface::BannedListChanged(in_stack_ffffffffffffff98);
    }
    DumpBanlist(in_stack_00000018);
    local_19 = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool BanMan::Unban(const CSubNet& sub_net)
{
    {
        LOCK(m_banned_mutex);
        if (m_banned.erase(sub_net) == 0) return false;
        m_is_dirty = true;
    }
    if (m_client_interface) m_client_interface->BannedListChanged();
    DumpBanlist(); //store banlist to disk immediately
    return true;
}